

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O0

int av1_apply_selfguided_restoration_avx2
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  __m256i v;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  void *a;
  int in_ECX;
  int in_EDX;
  longlong extraout_RDX;
  int in_ESI;
  void *a_00;
  long in_RDI;
  int in_R8D;
  int *in_R9;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  __m128i v_00;
  long in_stack_00000008;
  undefined4 in_stack_0000001c;
  __m256i res_1;
  __m256i tmp2_1;
  __m256i tmp_1;
  __m256i res;
  __m256i max;
  __m256i tmp2;
  __m256i tmp;
  __m256i w_1;
  __m256i w_0;
  __m256i rounding;
  __m256i f2_1;
  __m256i f2_0;
  __m256i f1_1;
  __m256i f1_0;
  __m256i v_1;
  __m256i v_0;
  __m256i u_1;
  __m256i u_0;
  __m128i src_1;
  __m128i src_0;
  __m256i ep_1;
  __m256i ep_0;
  uint8_t *dat8ij;
  int m;
  int k;
  int j;
  int i;
  __m256i xq1;
  __m256i xq0;
  int xq [2];
  sgr_params_type *params;
  int ret;
  int32_t *flt1;
  int32_t *flt0;
  undefined4 in_stack_fffffffffffff4e4;
  undefined4 in_stack_fffffffffffff4ec;
  uint shift;
  undefined4 in_stack_fffffffffffff4f4;
  void *in_stack_fffffffffffff510;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  int32_t *local_a80;
  undefined8 uStack_a78;
  int32_t *in_stack_fffffffffffff5a0;
  undefined8 in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5b0;
  uint8_t *in_stack_fffffffffffff5b8;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined1 in_stack_fffffffffffff5e0 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  int local_828;
  int local_824;
  undefined8 uStack_810;
  undefined8 uStack_808;
  uint local_7c8;
  uint local_7c4;
  sgr_params_type *local_7c0;
  int local_7b4;
  long local_7b0;
  long local_7a8;
  int *local_7a0;
  int local_798;
  int local_794;
  int local_790;
  int local_78c;
  long local_788;
  int local_77c;
  uint local_778;
  uint local_774;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined4 local_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined4 local_6e4;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined4 local_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [16];
  undefined1 auStack_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [16];
  undefined1 auStack_350 [16];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2a4;
  undefined1 local_2a0 [32];
  undefined4 local_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  ushort local_1e2;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  undefined1 local_c0 [32];
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  undefined1 local_80 [32];
  ushort local_58;
  ushort local_56;
  ushort local_54;
  ushort local_52;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  ushort local_48;
  ushort local_46;
  ushort local_44;
  ushort local_42;
  ushort local_40;
  ushort local_3e;
  ushort local_3c;
  ushort local_3a;
  
  local_7a8 = CONCAT44(in_stack_0000001c,dst_stride);
  local_7b0 = local_7a8 + 0x9dcd0;
  shift = (uint)tmpbuf;
  local_7a0 = in_R9;
  local_798 = in_R8D;
  local_794 = in_ECX;
  local_790 = in_EDX;
  local_78c = in_ESI;
  local_788 = in_RDI;
  local_7b4 = av1_selfguided_restoration_avx2
                        (in_stack_fffffffffffff5b8,(int)((ulong)in_stack_fffffffffffff5b0 >> 0x20),
                         (int)in_stack_fffffffffffff5b0,
                         (int)((ulong)in_stack_fffffffffffff5a8 >> 0x20),in_stack_fffffffffffff5a0,
                         local_a80,local_a40._24_4_,in_stack_fffffffffffff5e0._0_4_,
                         in_stack_fffffffffffff5e0._8_4_,in_stack_fffffffffffff5e0._16_4_);
  local_77c = local_7b4;
  if (local_7b4 == 0) {
    local_7c0 = av1_sgr_params + local_798;
    av1_decode_xq(local_7a0,(int *)&local_7c8,local_7c0);
    local_774 = local_7c8;
    local_c4 = local_7c8;
    local_c8 = local_7c8;
    local_cc = local_7c8;
    local_d0 = local_7c8;
    local_d4 = local_7c8;
    local_d8 = local_7c8;
    local_dc = local_7c8;
    local_e0 = local_7c8;
    auVar2 = vpinsrd_avx(ZEXT416(local_7c8),local_7c8,1);
    auVar2 = vpinsrd_avx(auVar2,local_7c8,2);
    auVar2 = vpinsrd_avx(auVar2,local_7c8,3);
    auVar9 = vpinsrd_avx(ZEXT416(local_7c8),local_7c8,1);
    auVar9 = vpinsrd_avx(auVar9,local_7c8,2);
    auStack_f0 = vpinsrd_avx(auVar9,local_7c8,3);
    local_100._0_8_ = auVar2._0_8_;
    uVar4 = local_100._0_8_;
    local_100._8_8_ = auVar2._8_8_;
    uVar5 = local_100._8_8_;
    uVar6 = auStack_f0._0_8_;
    uVar7 = auStack_f0._8_8_;
    local_778 = local_7c4;
    local_84 = local_7c4;
    local_88 = local_7c4;
    local_8c = local_7c4;
    local_90 = local_7c4;
    local_94 = local_7c4;
    local_98 = local_7c4;
    local_9c = local_7c4;
    local_a0 = local_7c4;
    a_00 = (void *)(ulong)local_7c4;
    auVar9 = vpinsrd_avx(ZEXT416(local_7c4),local_7c4,1);
    auVar9 = vpinsrd_avx(auVar9,local_7c4,2);
    auVar9 = vpinsrd_avx(auVar9,local_7c4,3);
    auVar10 = vpinsrd_avx(ZEXT416(local_7c4),local_7c4,1);
    auVar10 = vpinsrd_avx(auVar10,local_7c4,2);
    auVar10 = vpinsrd_avx(auVar10,local_7c4,3);
    auVar11._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar10;
    auVar11._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
    local_100 = auVar2;
    local_c0 = auVar11;
    auVar9 = auVar11._0_16_;
    for (local_824 = 0; local_824 < local_790; local_824 = local_824 + 1) {
      local_828 = 0;
      while( true ) {
        uStack_808 = auVar11._24_8_;
        uStack_810 = auVar11._16_8_;
        if (local_78c <= local_828) break;
        iVar8 = local_824 * local_78c + local_828;
        a = (void *)(local_788 + local_824 * local_794 + (long)local_828);
        if (bit_depth == 0) {
          xx_loadu_128(a);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = auVar9._0_8_;
          local_860 = vpmovzxbd_avx2(auVar10);
          local_750 = vpsrldq_avx(auVar9,8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_750._0_8_;
          local_880 = vpmovzxbd_avx2(auVar1);
          local_740 = auVar9;
        }
        else {
          xx_loadu_128((void *)((long)a * 2));
          auVar10 = auVar9;
          xx_loadu_128((void *)(((long)a + 8) * 2));
          local_860 = vpmovzxwd_avx2(auVar9);
          local_880 = vpmovzxwd_avx2(auVar10);
          local_770 = auVar10;
          local_760 = auVar9;
        }
        local_660 = local_860._0_8_;
        uStack_658 = local_860._8_8_;
        uStack_650 = local_860._16_8_;
        uStack_648 = local_860._24_8_;
        local_664 = 4;
        auVar3 = vpslld_avx2(local_860,ZEXT416(4));
        local_6a0 = local_880._0_8_;
        uStack_698 = local_880._8_8_;
        uStack_690 = local_880._16_8_;
        uStack_688 = local_880._24_8_;
        local_6a4 = 4;
        auVar15 = vpslld_avx2(local_880,ZEXT416(4));
        local_8c0 = auVar3._0_8_;
        uStack_8b8 = auVar3._8_8_;
        uStack_8b0 = auVar3._16_8_;
        uStack_8a8 = auVar3._24_8_;
        local_6e0 = local_8c0;
        uStack_6d8 = uStack_8b8;
        uStack_6d0 = uStack_8b0;
        uStack_6c8 = uStack_8a8;
        local_6e4 = 7;
        local_900 = vpslld_avx2(auVar3,ZEXT416(7));
        local_8e0 = auVar15._0_8_;
        uStack_8d8 = auVar15._8_8_;
        uStack_8d0 = auVar15._16_8_;
        uStack_8c8 = auVar15._24_8_;
        local_720 = local_8e0;
        uStack_718 = uStack_8d8;
        uStack_710 = uStack_8d0;
        uStack_708 = uStack_8c8;
        local_724 = 7;
        local_920 = vpslld_avx2(auVar15,ZEXT416(7));
        if (0 < local_7c0->r[0]) {
          auVar12 = local_920;
          yy_loadu_256((__m256i *)(local_7a8 + (long)iVar8 * 4),a_00);
          local_580 = local_8c0;
          uStack_578 = uStack_8b8;
          uStack_570 = uStack_8b0;
          uStack_568 = uStack_8a8;
          auVar14 = vpsubd_avx2(auVar12,auVar3);
          local_940 = auVar14._0_8_;
          uStack_938 = auVar14._8_8_;
          uStack_930 = auVar14._16_8_;
          uStack_928 = auVar14._24_8_;
          local_2e0 = uVar4;
          uStack_2d8 = uVar5;
          uStack_2d0 = uVar6;
          uStack_2c8 = uVar7;
          local_300 = local_940;
          uStack_2f8 = uStack_938;
          uStack_2f0 = uStack_930;
          uStack_2e8 = uStack_928;
          auVar13._16_8_ = uVar6;
          auVar13._0_16_ = auVar2;
          auVar13._24_8_ = uVar7;
          local_400 = vpmulld_avx2(auVar13,auVar14);
          local_3e0 = local_900._0_8_;
          uStack_3d8 = local_900._8_8_;
          uStack_3d0 = local_900._16_8_;
          uStack_3c8 = local_900._24_8_;
          local_900 = vpaddd_avx2(local_900,local_400);
          auVar13 = local_900;
          local_560 = auVar12;
          yy_loadu_256((__m256i *)(local_7a8 + (long)(iVar8 + 8) * 4),a_00);
          local_5c0 = local_8e0;
          uStack_5b8 = uStack_8d8;
          uStack_5b0 = uStack_8d0;
          uStack_5a8 = uStack_8c8;
          auVar14 = vpsubd_avx2(auVar13,auVar15);
          local_960 = auVar14._0_8_;
          uStack_958 = auVar14._8_8_;
          uStack_950 = auVar14._16_8_;
          uStack_948 = auVar14._24_8_;
          local_320 = uVar4;
          uStack_318 = uVar5;
          uStack_310 = uVar6;
          uStack_308 = uVar7;
          local_340 = local_960;
          uStack_338 = uStack_958;
          uStack_330 = uStack_950;
          uStack_328 = uStack_948;
          auVar12._16_8_ = uVar6;
          auVar12._0_16_ = auVar2;
          auVar12._24_8_ = uVar7;
          local_440 = vpmulld_avx2(auVar12,auVar14);
          local_420 = local_920._0_8_;
          uStack_418 = local_920._8_8_;
          uStack_410 = local_920._16_8_;
          uStack_408 = local_920._24_8_;
          local_920 = vpaddd_avx2(local_920,local_440);
          local_5a0 = auVar13;
        }
        if (0 < local_7c0->r[1]) {
          auVar12 = local_920;
          yy_loadu_256((__m256i *)(local_7b0 + (long)iVar8 * 4),a_00);
          local_600 = local_8c0;
          uStack_5f8 = uStack_8b8;
          uStack_5f0 = uStack_8b0;
          uStack_5e8 = uStack_8a8;
          auVar3 = vpsubd_avx2(auVar12,auVar3);
          local_980 = auVar3._0_8_;
          uStack_978 = auVar3._8_8_;
          uStack_970 = auVar3._16_8_;
          uStack_968 = auVar3._24_8_;
          local_380 = local_980;
          uStack_378 = uStack_978;
          uStack_370 = uStack_970;
          uStack_368 = uStack_968;
          auVar14._16_8_ = uStack_810;
          auVar14._0_16_ = auVar11._0_16_;
          auVar14._24_8_ = uStack_808;
          local_480 = vpmulld_avx2(auVar14,auVar3);
          local_460 = local_900._0_8_;
          uStack_458 = local_900._8_8_;
          uStack_450 = local_900._16_8_;
          uStack_448 = local_900._24_8_;
          local_900 = vpaddd_avx2(local_900,local_480);
          auVar14 = local_900;
          local_5e0 = auVar12;
          auStack_350 = auVar11._16_16_;
          local_360 = auVar11._0_16_;
          yy_loadu_256((__m256i *)(local_7b0 + (long)(iVar8 + 8) * 4),a_00);
          local_640 = local_8e0;
          uStack_638 = uStack_8d8;
          uStack_630 = uStack_8d0;
          uStack_628 = uStack_8c8;
          auVar3 = vpsubd_avx2(auVar14,auVar15);
          local_9a0 = auVar3._0_8_;
          uStack_998 = auVar3._8_8_;
          uStack_990 = auVar3._16_8_;
          uStack_988 = auVar3._24_8_;
          local_3c0 = local_9a0;
          uStack_3b8 = uStack_998;
          uStack_3b0 = uStack_990;
          uStack_3a8 = uStack_988;
          auVar15._16_8_ = uStack_810;
          auVar15._0_16_ = auVar11._0_16_;
          auVar15._24_8_ = uStack_808;
          local_4c0 = vpmulld_avx2(auVar15,auVar3);
          local_4a0 = local_920._0_8_;
          uStack_498 = local_920._8_8_;
          uStack_490 = local_920._16_8_;
          uStack_488 = local_920._24_8_;
          local_920 = vpaddd_avx2(local_920,local_4c0);
          local_620 = auVar14;
          auStack_390 = auVar11._16_16_;
          local_3a0 = auVar11._0_16_;
        }
        auVar15 = local_920;
        round_for_shift(shift);
        local_9c0 = auVar15._0_8_;
        uStack_9b8 = auVar15._8_8_;
        uStack_9b0 = auVar15._16_8_;
        uStack_9a8 = auVar15._24_8_;
        local_4e0 = local_900._0_8_;
        uStack_4d8 = local_900._8_8_;
        uStack_4d0 = local_900._16_8_;
        uStack_4c8 = local_900._24_8_;
        local_500 = local_9c0;
        uStack_4f8 = uStack_9b8;
        uStack_4f0 = uStack_9b0;
        uStack_4e8 = uStack_9a8;
        local_260 = vpaddd_avx2(local_900,auVar15);
        local_264 = 0xb;
        auVar3 = vpsrad_avx2(local_260,ZEXT416(0xb));
        local_520 = local_920._0_8_;
        uStack_518 = local_920._8_8_;
        uStack_510 = local_920._16_8_;
        uStack_508 = local_920._24_8_;
        local_540 = local_9c0;
        uStack_538 = uStack_9b8;
        uStack_530 = uStack_9b0;
        uStack_528 = uStack_9a8;
        local_2a0 = vpaddd_avx2(local_920,auVar15);
        local_2a4 = 0xb;
        auVar15 = vpsrad_avx2(local_2a0,ZEXT416(0xb));
        local_9e0 = auVar3._0_8_;
        uStack_9d8 = auVar3._8_8_;
        uStack_9d0 = auVar3._16_8_;
        uStack_9c8 = auVar3._24_8_;
        local_a00 = auVar15._0_8_;
        uStack_9f8 = auVar15._8_8_;
        uStack_9f0 = auVar15._16_8_;
        uStack_9e8 = auVar15._24_8_;
        if (bit_depth == 0) {
          local_180 = local_9e0;
          uStack_178 = uStack_9d8;
          uStack_170 = uStack_9d0;
          uStack_168 = uStack_9c8;
          local_1a0 = local_a00;
          uStack_198 = uStack_9f8;
          uStack_190 = uStack_9f0;
          uStack_188 = uStack_9e8;
          auVar3 = vpackssdw_avx2(auVar3,auVar15);
          auVar3 = vpermq_avx2(auVar3,0xd8);
          local_ac0 = auVar3._0_8_;
          uStack_ab8 = auVar3._8_8_;
          uStack_ab0 = auVar3._16_8_;
          uStack_aa8 = auVar3._24_8_;
          local_140 = local_ac0;
          uStack_138 = uStack_ab8;
          uStack_130 = uStack_ab0;
          uStack_128 = uStack_aa8;
          local_160 = local_ac0;
          uStack_158 = uStack_ab8;
          uStack_150 = uStack_ab0;
          uStack_148 = uStack_aa8;
          auVar3 = vpackuswb_avx2(auVar3,auVar3);
          local_120 = vpermq_avx2(auVar3,0xd8);
          v_00[1] = extraout_RDX;
          v_00[0] = (longlong)a_00;
          local_a80 = (int32_t *)local_120._0_8_;
          uStack_a78 = local_120._8_8_;
          in_stack_fffffffffffff510 = (void *)local_120._0_8_;
          xx_storeu_128((void *)(in_stack_00000008 + (local_824 * (int)dst8 + local_828)),v_00);
        }
        else {
          local_220 = local_9e0;
          uStack_218 = uStack_9d8;
          uStack_210 = uStack_9d0;
          uStack_208 = uStack_9c8;
          local_240 = local_a00;
          uStack_238 = uStack_9f8;
          uStack_230 = uStack_9f0;
          uStack_228 = uStack_9e8;
          auVar3 = vpackusdw_avx2(auVar3,auVar15);
          auVar15 = vpermq_avx2(auVar3,0xd8);
          local_1e2 = (short)(1 << ((byte)tmpbuf & 0x1f)) - 1;
          auVar9 = vpinsrw_avx(ZEXT216(local_1e2),(uint)local_1e2,1);
          auVar9 = vpinsrw_avx(auVar9,(uint)local_1e2,2);
          auVar9 = vpinsrw_avx(auVar9,(uint)local_1e2,3);
          auVar9 = vpinsrw_avx(auVar9,(uint)local_1e2,4);
          auVar9 = vpinsrw_avx(auVar9,(uint)local_1e2,5);
          auVar9 = vpinsrw_avx(auVar9,(uint)local_1e2,6);
          auVar9 = vpinsrw_avx(auVar9,(uint)local_1e2,7);
          auVar10 = vpinsrw_avx(ZEXT216(local_1e2),(uint)local_1e2,1);
          auVar10 = vpinsrw_avx(auVar10,(uint)local_1e2,2);
          auVar10 = vpinsrw_avx(auVar10,(uint)local_1e2,3);
          auVar10 = vpinsrw_avx(auVar10,(uint)local_1e2,4);
          auVar10 = vpinsrw_avx(auVar10,(uint)local_1e2,5);
          auVar10 = vpinsrw_avx(auVar10,(uint)local_1e2,6);
          auVar10 = vpinsrw_avx(auVar10,(uint)local_1e2,7);
          auVar16._0_16_ = ZEXT116(0) * auVar9 + ZEXT116(1) * auVar10;
          auVar16._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9;
          local_80._16_8_ = auVar16._16_8_;
          local_80._24_8_ = auVar16._24_8_;
          local_a40 = auVar15._0_8_;
          uStack_a38 = auVar15._8_8_;
          uStack_a30 = auVar15._16_8_;
          local_1c0 = local_a40;
          uStack_1b8 = uStack_a38;
          uStack_1b0 = uStack_a30;
          auVar3._16_8_ = local_80._16_8_;
          auVar3._0_16_ = auVar16._0_16_;
          auVar3._24_8_ = local_80._24_8_;
          auVar3 = vpminsw_avx2(auVar15,auVar3);
          local_a80 = auVar3._0_8_;
          uStack_a78 = auVar3._8_8_;
          v[1]._0_4_ = in_ESI;
          v[0] = 0x981c55;
          v[1]._4_4_ = in_stack_fffffffffffff4e4;
          v[2]._0_4_ = in_R8D;
          v[2]._4_4_ = in_stack_fffffffffffff4ec;
          v[3]._0_4_ = shift;
          v[3]._4_4_ = in_stack_fffffffffffff4f4;
          uStack_1a8 = auVar15._24_8_;
          local_80 = auVar16;
          local_58 = local_1e2;
          local_56 = local_1e2;
          local_54 = local_1e2;
          local_52 = local_1e2;
          local_50 = local_1e2;
          local_4e = local_1e2;
          local_4c = local_1e2;
          local_4a = local_1e2;
          local_48 = local_1e2;
          local_46 = local_1e2;
          local_44 = local_1e2;
          local_42 = local_1e2;
          local_40 = local_1e2;
          local_3e = local_1e2;
          local_3c = local_1e2;
          local_3a = local_1e2;
          local_1e0 = auVar16._0_16_;
          auStack_1d0 = auVar16._16_16_;
          yy_storeu_256(in_stack_fffffffffffff510,v);
        }
        auVar9._8_8_ = uStack_a78;
        auVar9._0_8_ = local_a80;
        local_828 = local_828 + 0x10;
      }
    }
    local_77c = 0;
  }
  return local_77c;
}

Assistant:

int av1_apply_selfguided_restoration_avx2(const uint8_t *dat8, int width,
                                          int height, int stride, int eps,
                                          const int *xqd, uint8_t *dst8,
                                          int dst_stride, int32_t *tmpbuf,
                                          int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);
  const int ret = av1_selfguided_restoration_avx2(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);

  __m256i xq0 = _mm256_set1_epi32(xq[0]);
  __m256i xq1 = _mm256_set1_epi32(xq[1]);

  for (int i = 0; i < height; ++i) {
    // Calculate output in batches of 16 pixels
    for (int j = 0; j < width; j += 16) {
      const int k = i * width + j;
      const int m = i * dst_stride + j;

      const uint8_t *dat8ij = dat8 + i * stride + j;
      __m256i ep_0, ep_1;
      __m128i src_0, src_1;
      if (highbd) {
        src_0 = xx_loadu_128(CONVERT_TO_SHORTPTR(dat8ij));
        src_1 = xx_loadu_128(CONVERT_TO_SHORTPTR(dat8ij + 8));
        ep_0 = _mm256_cvtepu16_epi32(src_0);
        ep_1 = _mm256_cvtepu16_epi32(src_1);
      } else {
        src_0 = xx_loadu_128(dat8ij);
        ep_0 = _mm256_cvtepu8_epi32(src_0);
        ep_1 = _mm256_cvtepu8_epi32(_mm_srli_si128(src_0, 8));
      }

      const __m256i u_0 = _mm256_slli_epi32(ep_0, SGRPROJ_RST_BITS);
      const __m256i u_1 = _mm256_slli_epi32(ep_1, SGRPROJ_RST_BITS);

      __m256i v_0 = _mm256_slli_epi32(u_0, SGRPROJ_PRJ_BITS);
      __m256i v_1 = _mm256_slli_epi32(u_1, SGRPROJ_PRJ_BITS);

      if (params->r[0] > 0) {
        const __m256i f1_0 = _mm256_sub_epi32(yy_loadu_256(&flt0[k]), u_0);
        v_0 = _mm256_add_epi32(v_0, _mm256_mullo_epi32(xq0, f1_0));

        const __m256i f1_1 = _mm256_sub_epi32(yy_loadu_256(&flt0[k + 8]), u_1);
        v_1 = _mm256_add_epi32(v_1, _mm256_mullo_epi32(xq0, f1_1));
      }

      if (params->r[1] > 0) {
        const __m256i f2_0 = _mm256_sub_epi32(yy_loadu_256(&flt1[k]), u_0);
        v_0 = _mm256_add_epi32(v_0, _mm256_mullo_epi32(xq1, f2_0));

        const __m256i f2_1 = _mm256_sub_epi32(yy_loadu_256(&flt1[k + 8]), u_1);
        v_1 = _mm256_add_epi32(v_1, _mm256_mullo_epi32(xq1, f2_1));
      }

      const __m256i rounding =
          round_for_shift(SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m256i w_0 = _mm256_srai_epi32(
          _mm256_add_epi32(v_0, rounding), SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m256i w_1 = _mm256_srai_epi32(
          _mm256_add_epi32(v_1, rounding), SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      if (highbd) {
        // Pack into 16 bits and clamp to [0, 2^bit_depth)
        // Note that packing into 16 bits messes up the order of the bits,
        // so we use a permute function to correct this
        const __m256i tmp = _mm256_packus_epi32(w_0, w_1);
        const __m256i tmp2 = _mm256_permute4x64_epi64(tmp, 0xd8);
        const __m256i max = _mm256_set1_epi16((1 << bit_depth) - 1);
        const __m256i res = _mm256_min_epi16(tmp2, max);
        yy_storeu_256(CONVERT_TO_SHORTPTR(dst8 + m), res);
      } else {
        // Pack into 8 bits and clamp to [0, 256)
        // Note that each pack messes up the order of the bits,
        // so we use a permute function to correct this
        const __m256i tmp = _mm256_packs_epi32(w_0, w_1);
        const __m256i tmp2 = _mm256_permute4x64_epi64(tmp, 0xd8);
        const __m256i res =
            _mm256_packus_epi16(tmp2, tmp2 /* "don't care" value */);
        const __m128i res2 =
            _mm256_castsi256_si128(_mm256_permute4x64_epi64(res, 0xd8));
        xx_storeu_128(dst8 + m, res2);
      }
    }
  }
  return 0;
}